

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

void __thiscall ghc::filesystem::directory_iterator::impl::~impl(impl *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if ((DIR *)this->_dir != (DIR *)0x0) {
    closedir((DIR *)this->_dir);
  }
  pcVar1 = (this->_dir_entry)._path._path._M_dataplus._M_p;
  paVar2 = &(this->_dir_entry)._path._path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->_base)._path._M_dataplus._M_p;
  paVar2 = &(this->_base)._path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~impl()
    {
        if (_dir) {
            ::closedir(_dir);
        }
    }